

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  bool *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  char *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  key_equal *in_stack_fffffffffffffb68;
  Type TVar4;
  string *s;
  hasher *in_stack_fffffffffffffb70;
  size_type in_stack_fffffffffffffb78;
  size_t sVar5;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffb80;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  char *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  AssertHelper *in_stack_fffffffffffffbc0;
  AssertionResult local_3c8 [2];
  AssertionResult local_3a8;
  string local_398 [55];
  undefined1 local_361;
  AssertionResult local_360;
  StringIO local_350;
  string local_348;
  allocator local_311;
  string local_310 [32];
  AssertionResult local_2f0 [2];
  allocator local_2c9;
  string local_2c8 [32];
  AssertionResult local_2a8 [2];
  int local_288;
  undefined4 local_284;
  AssertionResult local_280 [2];
  size_t local_260;
  AssertionResult local_258;
  char local_248 [48];
  undefined8 local_218;
  AssertionResult local_210;
  size_t local_200;
  string local_1f8 [55];
  undefined1 local_1c1;
  AssertionResult local_1c0;
  string local_1b0 [55];
  undefined1 local_179;
  AssertionResult local_178;
  string local_168 [55];
  undefined1 local_131;
  AssertionResult local_130;
  FILE *local_120;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [48];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8 [2];
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_90;
  
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffb40,
             (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffb40,
             (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
             in_stack_fffffffffffffb68,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  TVar4 = (Type)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,anon_var_dwarf_14da82,0x18,&local_e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"$hu1",0x14,&local_111);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  bVar1 = google::
          HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite(&local_90);
  if (bVar1) {
    local_120 = tmpfile();
    local_131 = local_120 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
               (type *)0xfb6626);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_168);
      testing::Message::~Message((Message *)0xfb6777);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb680b);
    local_179 = google::
                HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::write_metadata<_IO_FILE>(&local_90,(_IO_FILE *)local_120);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
               (type *)0xfb6852);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_1b0);
      testing::Message::~Message((Message *)0xfb6927);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb69bb);
    local_1c1 = google::
                HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::write_nopointer_data<_IO_FILE>(&local_90,(_IO_FILE *)local_120);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
               (type *)0xfb6a02);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_1f8);
      testing::Message::~Message((Message *)0xfb6ad7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb6b6e);
    local_200 = ftell(local_120);
    rewind(local_120);
    local_218 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (unsigned_long *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0xfb6c23);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xfb6c86);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb6cf7);
    local_260 = fread(local_248,1,local_200,local_120);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (unsigned_long *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      in_stack_fffffffffffffbc0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfb6da6);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xfb6e09);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb6e7a);
    local_284 = 0xffffffff;
    in_stack_fffffffffffffbbc = fgetc(local_120);
    local_288 = in_stack_fffffffffffffbbc;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
               (int *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (int *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_280);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      in_stack_fffffffffffffbb0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfb6f1c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                 (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xfb6f79);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb6fea);
    fclose(local_120);
    in_stack_fffffffffffffba4 = (int)local_248[0];
    in_stack_fffffffffffffba8 = (char *)std::__cxx11::string::operator[]((ulong)local_e8);
    sVar5 = local_200;
    if (in_stack_fffffffffffffba4 == *in_stack_fffffffffffffba8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,local_248,sVar5,&local_2c9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        testing::AssertionResult::failure_message((AssertionResult *)0xfb7147);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                   (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                   (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbc0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
        testing::Message::~Message((Message *)0xfb71a4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb720f);
    }
    else {
      paVar6 = &local_311;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,local_248,sVar5,paVar6);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        in_stack_fffffffffffffb70 =
             (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xfb732a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                   (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                   (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),in_stack_fffffffffffffb50);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbc0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
        testing::Message::~Message((Message *)0xfb7387);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb73f2);
    }
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  bVar1 = google::
          HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization(&local_90);
  if (bVar1) {
    s = &local_348;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_350,s);
    TVar4 = (Type)((ulong)s >> 0x20);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_90.
                        super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       ,&local_350);
    local_361 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
               (type *)0xfb7485);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                 (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60),iVar3,in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbc0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_398);
      testing::Message::~Message((Message *)0xfb7561);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb75f8);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_348);
    iVar3 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_e8);
    if (iVar3 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_fffffffffffffb48),in_stack_fffffffffffffb40);
      iVar3 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfb76bb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60),iVar3,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbc0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfb7718);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb7783);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar3,in_stack_fffffffffffffb48),in_stack_fffffffffffffb40);
      iVar3 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        testing::AssertionResult::failure_message((AssertionResult *)0xfb77fb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb70,TVar4,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60),iVar3,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbc0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
        testing::Message::~Message((Message *)0xfb7856);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb78c1);
    }
    std::__cxx11::string::~string((string *)&local_348);
  }
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_e8);
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xfb7917);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}